

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

IntBoundedValueInfo * __thiscall
GlobOpt::NewIntBoundedValueInfo(GlobOpt *this,ValueInfo *originalValueInfo,IntBounds *bounds)

{
  ValueType type;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  IntBoundedValueInfo *this_00;
  
  if (originalValueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1136,"(originalValueInfo)","originalValueInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  IntBounds::Verify(bounds);
  type.field_0 = (anon_union_2_4_ea848c7b_for_ValueType_13)
                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(originalValueInfo->super_ValueType).field_0.field_0;
  iVar3 = IntBounds::ConstantLowerBound(bounds);
  if (iVar3 < 1) {
    iVar3 = IntBounds::ConstantUpperBound(bounds);
    if (-1 < iVar3) {
      bVar2 = ValueInfo::WasNegativeZeroPreventedByBailout(originalValueInfo);
      goto LAB_0045925a;
    }
  }
  bVar2 = false;
LAB_0045925a:
  this_00 = IntBoundedValueInfo::New(type,bounds,bVar2,this->alloc);
  ValueInfo::SetSymStore(&this_00->super_ValueInfo,originalValueInfo->symStore);
  return this_00;
}

Assistant:

IntBoundedValueInfo *GlobOpt::NewIntBoundedValueInfo(
    const ValueInfo *const originalValueInfo,
    const IntBounds *const bounds) const
{
    Assert(originalValueInfo);
    bounds->Verify();

    IntBoundedValueInfo *const valueInfo =
        IntBoundedValueInfo::New(
            originalValueInfo->Type(),
            bounds,
            (
                bounds->ConstantLowerBound() <= 0 &&
                bounds->ConstantUpperBound() >= 0 &&
                originalValueInfo->WasNegativeZeroPreventedByBailout()
            ),
            alloc);
    valueInfo->SetSymStore(originalValueInfo->GetSymStore());
    return valueInfo;
}